

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O2

string * getLinuxFolderDefault_abi_cxx11_
                   (string *__return_storage_ptr__,char *envName,char *defaultRelativePath)

{
  char *pcVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [6];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = getenv(envName);
  if (pcVar1 == (char *)0x0) {
    sago::internal::getHome_abi_cxx11_();
    std::operator+(&local_108,&bStack_128,"/");
    std::operator+(local_e8,&local_108,defaultRelativePath);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&bStack_128);
  }
  else {
    if (*pcVar1 != '/') {
      snprintf((char *)local_e8,200,
               "Environment \"%s\" does not start with an \'/\'. XDG specifies that the value must be absolute. The current value is: \"%s\""
               ,envName,pcVar1);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(char *)local_e8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLinuxFolderDefault(const char* envName, const char* defaultRelativePath) {
	std::string res;
	const char* tempRes = std::getenv(envName);
	if (tempRes) {
		throwOnRelative(envName, tempRes);
		res = tempRes;
		return res;
	}
	res = sago::internal::getHome() + "/" + defaultRelativePath;
	return res;
}